

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int CVmObjVector::static_getp_generate(vm_val_t *retval,uint *in_argc)

{
  size_t sVar1;
  CVmObjPageEntry *pCVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  vm_datatype_t *pvVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  int iVar7;
  uint uVar8;
  vm_obj_id_t vVar9;
  size_t idx;
  uint uVar10;
  vm_val_t *val;
  uint16_t tmp;
  ulong element_count;
  bool bVar11;
  CVmFuncPtr funcdesc;
  vm_rcdesc rc;
  
  if (in_argc == (uint *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = *in_argc;
  }
  if (static_getp_generate(vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar7 = __cxa_guard_acquire(&static_getp_generate(vm_val_t*,unsigned_int*)::desc);
    if (iVar7 != 0) {
      static_getp_generate::desc.min_argc_ = 2;
      static_getp_generate::desc.opt_argc_ = 0;
      static_getp_generate::desc.varargs_ = 0;
      __cxa_guard_release(&static_getp_generate(vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,in_argc,&static_getp_generate::desc);
  if (iVar7 == 0) {
    val = sp_ + -1;
    funcdesc.p_ = (uchar *)0x0;
    iVar7 = CVmFuncPtr::set(&funcdesc,val);
    if (iVar7 == 0) {
      err_throw(0x900);
    }
    uVar8 = vm_val_t::num_to_int(sp_ + -2);
    if ((int)uVar8 < 0) {
      err_throw(0x902);
    }
    element_count = (ulong)uVar8;
    vVar9 = create(0,element_count);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar9;
    pvVar6 = sp_;
    pCVar2 = G_obj_table_X.pages_[vVar9 >> 0xc];
    uVar5 = *(undefined4 *)&retval->field_0x4;
    aVar3 = retval->val;
    sp_ = sp_ + 1;
    pvVar6->typ = retval->typ;
    *(undefined4 *)&pvVar6->field_0x4 = uVar5;
    pvVar6->val = aVar3;
    if ((char)*funcdesc.p_ < '\0') {
      uVar8 = 1;
    }
    else {
      uVar8 = (uint)(*funcdesc.p_ != '\0' || funcdesc.p_[1] != '\0');
    }
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"Vector.generate");
    idx = 0;
    while (pvVar6 = sp_, bVar11 = element_count != 0, element_count = element_count - 1, bVar11) {
      sVar1 = idx + 1;
      pvVar4 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar4 = VM_INT;
      (pvVar6->val).obj = (vm_obj_id_t)sVar1;
      CVmRun::call_func_ptr(&G_interpreter_X,val,uVar8,&rc,0);
      sp_ = sp_ + -(ulong)(uVar8 ^ 1);
      set_element((CVmObjVector *)(pCVar2 + (vVar9 & 0xfff)),idx,&r0_);
      *(short *)(*(long *)((long)&pCVar2[vVar9 & 0xfff].ptr_ + 8) + 2) = (short)sVar1;
      idx = sVar1;
    }
    sp_ = sp_ + -(long)(int)(uVar10 + 1);
  }
  return 1;
}

Assistant:

int CVmObjVector::static_getp_generate(VMG_ vm_val_t *retval, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the callback function argument */
    vm_val_t *func = G_stk->get(0);

    /* make sure it's a function; set up a header pointer if it is */
    CVmFuncPtr funcdesc;
    if (!funcdesc.set(vmg_ func))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the count */
    int32_t cnt = G_stk->get(1)->num_to_int(vmg0_);

    /* make sure it's not negative */
    if (cnt < 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* create the vector */
    retval->set_obj(CVmObjVector::create(vmg_ FALSE, cnt));
    CVmObjVector *vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);
    
    /* push the new vector for gc protection */
    G_stk->push(retval);
    
    /* find out how many arguments the function wants */
    int fargc = funcdesc.is_varargs() ? -1 : funcdesc.get_max_argc();

    /* set up our recursive call descriptor */
    vm_rcdesc rc(vmg_ "Vector.generate",
                 CVmObjVector::metaclass_reg_->get_class_obj(vmg0_),
                 PROPIDX_generate, func, argc);

    /* generate the elements */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* push the callback arguments */
        const int pushed_argc = 1;
        G_stk->push()->set_int(i+1);
        
        /* adjust the arguments for what the callback actually wants */
        int sent_argc = fargc < 0 || fargc > pushed_argc ? pushed_argc : fargc;
        
        /* call the callback */
        G_interpreter->call_func_ptr(vmg_ func, sent_argc, &rc, 0);
        
        /* discard excess arguments */
        G_stk->discard(pushed_argc - sent_argc);
        
        /* add the result to the list */
        vec->set_element(i, G_interpreter->get_r0());
        vec->set_element_count(i+1);
    }

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}